

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O0

TaprootScriptTree *
cfd::core::TaprootScriptTree::FromString
          (TaprootScriptTree *__return_storage_ptr__,string *text,Script *tapscript,
          vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *target_nodes)

{
  bool bVar1;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *this;
  iterator in_stack_fffffffffffffdd0;
  reference in_stack_fffffffffffffde0;
  TapBranch local_208;
  ByteData256 *local_190;
  __normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
  local_188;
  __normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
  local_180;
  const_iterator local_178;
  ByteData256 local_170;
  undefined1 local_158 [8];
  TaprootScriptTree target_leaf;
  undefined1 local_b8 [8];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> check_nodes;
  TapBranch branch;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *target_nodes_local;
  Script *tapscript_local;
  string *text_local;
  
  TapBranch::FromString
            ((TapBranch *)
             &check_nodes.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,text);
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_b8,
             target_nodes);
  bVar1 = ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::empty
                    ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                     local_b8);
  if (!bVar1) {
    TaprootScriptTree((TaprootScriptTree *)local_158,tapscript);
    in_stack_fffffffffffffde0 =
         ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::back
                   ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                    local_b8);
    GetTapLeafHash(&local_170,(TaprootScriptTree *)local_158);
    bVar1 = ByteData256::Equals(in_stack_fffffffffffffde0,&local_170);
    ByteData256::~ByteData256((ByteData256 *)0x4946a3);
    if (bVar1) {
      this = (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_b8;
      local_188._M_current =
           (ByteData256 *)
           ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::end(this)
      ;
      local_180 = __gnu_cxx::
                  __normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
                  ::operator-(&local_188,1);
      __gnu_cxx::
      __normal_iterator<cfd::core::ByteData256_const*,std::vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>>>
      ::__normal_iterator<cfd::core::ByteData256*>
                ((__normal_iterator<cfd::core::ByteData256_const*,std::vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>>>
                  *)&local_178,&local_180);
      in_stack_fffffffffffffdd0 =
           ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::erase
                     (this,local_178);
      local_190 = (ByteData256 *)in_stack_fffffffffffffdd0;
    }
    ~TaprootScriptTree((TaprootScriptTree *)in_stack_fffffffffffffdd0._M_current);
  }
  TapBranch::ChangeTapLeaf
            (&local_208,
             (TapBranch *)
             &check_nodes.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,tapscript,
             (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_b8);
  TapBranch::operator=
            ((TapBranch *)
             &check_nodes.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_208);
  TapBranch::~TapBranch((TapBranch *)in_stack_fffffffffffffdd0._M_current);
  TaprootScriptTree(__return_storage_ptr__,
                    (TapBranch *)
                    &check_nodes.
                     super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             in_stack_fffffffffffffde0);
  TapBranch::~TapBranch((TapBranch *)in_stack_fffffffffffffdd0._M_current);
  return __return_storage_ptr__;
}

Assistant:

TaprootScriptTree TaprootScriptTree::FromString(
    const std::string& text, const Script& tapscript,
    const std::vector<ByteData256>& target_nodes) {
  auto branch = TapBranch::FromString(text);
  auto check_nodes = target_nodes;
  if (!check_nodes.empty()) {
    TaprootScriptTree target_leaf(tapscript);
    if (check_nodes.back().Equals(target_leaf.GetTapLeafHash())) {
      check_nodes.erase(check_nodes.end() - 1);
    }
  }
  branch = branch.ChangeTapLeaf(tapscript, check_nodes);
  return TaprootScriptTree(branch);
}